

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_MapFeatures_Test::
~ParseEditionsTest_MapFeatures_Test(ParseEditionsTest_MapFeatures_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseEditionsTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_01937440;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseEditionsTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseEditionsTest).input_);
  pZVar1 = (this->super_ParseEditionsTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseEditionsTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseEditionsTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseEditionsTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, MapFeatures) {
  ExpectParsesTo(
      R"schema(
        edition = '2023';
        message Foo {
          map<string, int> map_field = 1 [
            features.my_feature = SOMETHING
          ];
        })schema",
      R"pb(message_type {
             name: "Foo"
             field {
               name: "map_field"
               number: 1
               label: LABEL_REPEATED
               type_name: "MapFieldEntry"
               options {
                 uninterpreted_option {
                   name { name_part: "features" is_extension: false }
                   name { name_part: "my_feature" is_extension: false }
                   identifier_value: "SOMETHING"
                 }
               }
             }
             nested_type {
               name: "MapFieldEntry"
               field {
                 name: "key"
                 number: 1
                 label: LABEL_OPTIONAL
                 type: TYPE_STRING
                 options {
                   uninterpreted_option {
                     name { name_part: "features" is_extension: false }
                     name { name_part: "my_feature" is_extension: false }
                     identifier_value: "SOMETHING"
                   }
                 }
               }
               field {
                 name: "value"
                 number: 2
                 label: LABEL_OPTIONAL
                 type_name: "int"
                 options {
                   uninterpreted_option {
                     name { name_part: "features" is_extension: false }
                     name { name_part: "my_feature" is_extension: false }
                     identifier_value: "SOMETHING"
                   }
                 }
               }
               options { map_entry: true }
             }
           }
           syntax: "editions"
           edition: EDITION_2023)pb");
}